

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall
google::protobuf::DynamicMessageFactory::~DynamicMessageFactory(DynamicMessageFactory *this)

{
  PrototypeMap *pPVar1;
  TypeInfo *this_00;
  void *in_RDX;
  void *extraout_RDX;
  uint32 *in_RSI;
  __node_base *p_Var2;
  
  (this->super_MessageFactory)._vptr_MessageFactory =
       (_func_int **)&PTR__DynamicMessageFactory_004261a0;
  pPVar1 = (this->prototypes_).ptr_;
  if (pPVar1 != (PrototypeMap *)0x0) {
    p_Var2 = &(pPVar1->map_).
              super_unordered_map<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessage::TypeInfo_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>_>
              ._M_h._M_before_begin;
    do {
      p_Var2 = p_Var2->_M_nxt;
      if (p_Var2 == (__node_base *)0x0) {
        internal::Mutex::~Mutex(&this->prototypes_mutex_);
        internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::~scoped_ptr
                  (&this->prototypes_);
        MessageFactory::~MessageFactory(&this->super_MessageFactory);
        return;
      }
      DeleteDefaultOneofInstance
                ((Descriptor *)
                 (*(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor)
                 [5]._M_nxt,in_RSI,in_RDX);
      this_00 = *(TypeInfo **)&((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor;
      if (this_00 != (TypeInfo *)0x0) {
        DynamicMessage::TypeInfo::~TypeInfo(this_00);
      }
      in_RSI = (uint32 *)0x58;
      operator_delete(this_00,0x58);
      in_RDX = extraout_RDX;
    } while ((this->prototypes_).ptr_ != (PrototypeMap *)0x0);
  }
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::operator->() const [C = google::protobuf::DynamicMessageFactory::PrototypeMap]"
               );
}

Assistant:

DynamicMessageFactory::~DynamicMessageFactory() {
  for (PrototypeMap::Map::iterator iter = prototypes_->map_.begin();
       iter != prototypes_->map_.end(); ++iter) {
    DeleteDefaultOneofInstance(iter->second->type,
                               iter->second->offsets.get(),
                               iter->second->prototype);
    delete iter->second;
  }
}